

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

duckdb_data_chunk duckdb_result_get_chunk(duckdb_result result,idx_t chunk_idx)

{
  pointer pQVar1;
  MaterializedQueryResult *this;
  ColumnDataCollection *this_00;
  idx_t iVar2;
  DataChunk *this_01;
  pointer this_02;
  Allocator *allocator;
  type result_00;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_20;
  
  if (((result.internal_data != (void *)0x0) &&
      (*(char *)((long)result.internal_data + 8) != '\x03')) &&
     (pQVar1 = duckdb::
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data),
     (pQVar1->super_BaseQueryResult).type == MATERIALIZED_RESULT)) {
    *(undefined1 *)((long)result.internal_data + 8) = 1;
    this = (MaterializedQueryResult *)
           duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)result.internal_data);
    this_00 = duckdb::MaterializedQueryResult::Collection(this);
    iVar2 = duckdb::ColumnDataCollection::ChunkCount(this_00);
    if (chunk_idx < iVar2) {
      this_01 = (DataChunk *)operator_new(0x40);
      duckdb::DataChunk::DataChunk(this_01);
      local_20._M_head_impl = this_01;
      this_02 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)&local_20);
      allocator = duckdb::Allocator::DefaultAllocator();
      duckdb::DataChunk::Initialize(this_02,allocator,&this_00->types,0x800);
      result_00 = duckdb::
                  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_20);
      duckdb::ColumnDataCollection::FetchChunk(this_00,chunk_idx,result_00);
      return (duckdb_data_chunk)local_20._M_head_impl;
    }
  }
  return (duckdb_data_chunk)0x0;
}

Assistant:

duckdb_data_chunk duckdb_result_get_chunk(duckdb_result result, idx_t chunk_idx) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	if (result_data.result_set_type == duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_DEPRECATED) {
		return nullptr;
	}
	if (result_data.result->type != duckdb::QueryResultType::MATERIALIZED_RESULT) {
		// This API is only supported for materialized query results
		return nullptr;
	}
	result_data.result_set_type = duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_MATERIALIZED;
	auto &materialized = reinterpret_cast<duckdb::MaterializedQueryResult &>(*result_data.result);
	auto &collection = materialized.Collection();
	if (chunk_idx >= collection.ChunkCount()) {
		return nullptr;
	}
	auto chunk = duckdb::make_uniq<duckdb::DataChunk>();
	chunk->Initialize(duckdb::Allocator::DefaultAllocator(), collection.Types());
	collection.FetchChunk(chunk_idx, *chunk);
	return reinterpret_cast<duckdb_data_chunk>(chunk.release());
}